

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapPromiseInfo(SnapObject *snpObject,InflateMap *inflator)

{
  SnapPromiseInfo *pSVar1;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar2;
  Type local_a0;
  RecyclableObject *res;
  JavascriptPromiseReaction *reaction_1;
  undefined1 local_80 [4];
  uint32 i_1;
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> rejectReactions;
  JavascriptPromiseReaction *local_58;
  JavascriptPromiseReaction *reaction;
  undefined1 local_48 [4];
  uint32 i;
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> resolveReactions;
  Var result;
  ScriptContext *ctx;
  SnapPromiseInfo *promiseInfo;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseInfo*,(TTD::NSSnapObjects::SnapObjectType)28>
                     (snpObject);
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (pSVar1->Result == (TTDVar)0x0) {
    local_a0 = (Type)0x0;
  }
  else {
    local_a0 = (Type)InflateMap::InflateTTDVar(inflator,pSVar1->Result);
  }
  resolveReactions.allocator = local_a0;
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::SList
            ((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)local_48,
             &Memory::HeapAllocator::Instance);
  for (reaction._4_4_ = 0; reaction._4_4_ < pSVar1->ResolveReactionCount;
      reaction._4_4_ = reaction._4_4_ + 1) {
    local_58 = NSSnapValues::InflatePromiseReactionInfo
                         (pSVar1->ResolveReactions + reaction._4_4_,this,inflator);
    SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::Prepend
              ((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)local_48,
               &local_58);
  }
  SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::Reverse
            ((SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
             local_48);
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::SList
            ((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)local_80,
             &Memory::HeapAllocator::Instance);
  for (reaction_1._4_4_ = 0; reaction_1._4_4_ < pSVar1->RejectReactionCount;
      reaction_1._4_4_ = reaction_1._4_4_ + 1) {
    res = (RecyclableObject *)
          NSSnapValues::InflatePromiseReactionInfo
                    (pSVar1->RejectReactions + reaction_1._4_4_,this,inflator);
    SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::Prepend
              ((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)local_80,
               (JavascriptPromiseReaction **)&res);
  }
  SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::Reverse
            ((SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
             local_80);
  this_00 = Js::ScriptContext::GetLibrary(this);
  pRVar2 = Js::JavascriptLibrary::CreatePromise_TTD
                     (this_00,pSVar1->Status,(bool)(pSVar1->isHandled & 1),
                      resolveReactions.allocator,
                      (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
                      local_48,(SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>
                                *)local_80);
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::~SList
            ((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)local_80);
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::~SList
            ((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)local_48);
  return pRVar2;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapPromiseInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            const SnapPromiseInfo* promiseInfo = SnapObjectGetAddtlInfoAs<SnapPromiseInfo*, SnapObjectType::SnapPromiseObject>(snpObject);
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            Js::Var result = (promiseInfo->Result != nullptr) ? inflator->InflateTTDVar(promiseInfo->Result) : nullptr;

            SList<Js::JavascriptPromiseReaction*, HeapAllocator> resolveReactions(&HeapAllocator::Instance);
            for(uint32 i = 0; i < promiseInfo->ResolveReactionCount; ++i)
            {
                Js::JavascriptPromiseReaction* reaction = NSSnapValues::InflatePromiseReactionInfo(promiseInfo->ResolveReactions + i, ctx, inflator);
                resolveReactions.Prepend(reaction);
            }
            resolveReactions.Reverse();

            SList<Js::JavascriptPromiseReaction*, HeapAllocator> rejectReactions(&HeapAllocator::Instance);
            for(uint32 i = 0; i < promiseInfo->RejectReactionCount; ++i)
            {
                Js::JavascriptPromiseReaction* reaction = NSSnapValues::InflatePromiseReactionInfo(promiseInfo->RejectReactions + i, ctx, inflator);
                rejectReactions.Prepend(reaction);
            }
            rejectReactions.Reverse();

            Js::RecyclableObject* res = ctx->GetLibrary()->CreatePromise_TTD(promiseInfo->Status, promiseInfo->isHandled, result, resolveReactions, rejectReactions);

            return res;
        }